

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

int dns_validate_request(char *req,size_t len)

{
  uint16_t uVar1;
  dns_header_t *header;
  size_t len_local;
  char *req_local;
  
  if ((((0xb < len) && ((*(ushort *)(req + 2) >> 7 & 1) == 0)) &&
      ((*(ushort *)(req + 2) >> 0xe & 1) == 0)) &&
     ((uVar1 = ntohs(*(uint16_t *)(req + 4)), uVar1 != 0 &&
      (uVar1 = ntohs(*(uint16_t *)(req + 6)), uVar1 == 0)))) {
    return 0;
  }
  return -1;
}

Assistant:

int dns_validate_request(const char * req, size_t len)
{
    struct dns_header_t * header = (struct dns_header_t *)req;
    if (len < sizeof(*header))
        return -1;

    if (header->qr == 0 /* query */
       && header->z == 0 /* Z is Zero */
       && ntohs(header->qdcount) /* some questions */
       && !ntohs(header->ancount)/* no answers */
       )
        return 0;
    return -1;
}